

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::CoapSecure::Start
          (Error *__return_storage_ptr__,CoapSecure *this,ConnectHandler *aOnConnected,
          string *aLocalAddr,uint16_t aLocalPort)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> local_d0;
  string local_b0;
  undefined1 local_90 [40];
  pointer local_68;
  size_type sStack_60;
  ulong local_58;
  ulong local_48;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar1 = UdpSocket::Bind((this->mSocket).
                          super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,aLocalAddr,aLocalPort);
  if (uVar1 == 0) {
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              (&local_d0,aOnConnected);
    DtlsSession::Connect(&this->mDtlsSession,&local_d0);
    std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  }
  else {
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_int_&,_FMT_COMPILE_STRING,_0>
              ();
    local_68 = (aLocalAddr->_M_dataplus)._M_p;
    sStack_60 = aLocalAddr->_M_string_length;
    local_58 = (ulong)aLocalPort;
    local_48 = (ulong)uVar1;
    fmt.size_ = 0x12d;
    fmt.data_ = (char *)0x30;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"bind socket to local addr={}, port={} failed: {}",fmt,args);
    local_90._0_4_ = kIOError;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    Error::operator=(__return_storage_ptr__,(Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Start(DtlsSession::ConnectHandler aOnConnected, const std::string &aLocalAddr, uint16_t aLocalPort)
    {
        Error error;

        if (int fail = mSocket->Bind(aLocalAddr, aLocalPort))
        {
            ExitNow(error = ERROR_IO_ERROR("bind socket to local addr={}, port={} failed: {}", aLocalAddr, aLocalPort,
                                           fail));
        }
        mDtlsSession.Connect(aOnConnected);

    exit:
        return error;
    }